

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

completion * __thiscall
mjs::interpreter::impl::operator()(completion *__return_storage_ptr__,impl *this,do_statement *s)

{
  bool bVar1;
  label_set ls;
  _Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  local_b0;
  completion local_98;
  value local_58;
  
  get_labels((label_set *)&local_b0,this,&s->super_statement);
  completion::completion(__return_storage_ptr__,(value *)&value::undefined,normal);
  do {
    eval(&local_98,this,
         (s->s_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
         _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
         super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl);
    completion::operator=(__return_storage_ptr__,&local_98);
    value::~value(&local_98.result);
    bVar1 = handle_completion(__return_storage_ptr__,(label_set *)&local_b0);
    if (bVar1) goto LAB_0011c23d;
    eval(&local_58,this,
         (s->cond_)._M_t.
         super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
         super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
         super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
    get_value((value *)&local_98,this,&local_58);
    bVar1 = to_boolean((value *)&local_98);
    value::~value((value *)&local_98);
    value::~value(&local_58);
  } while (bVar1);
  if (__return_storage_ptr__->type != normal) {
    __assert_fail("!c",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                  ,0x3aa,"completion mjs::interpreter::impl::operator()(const do_statement &)");
  }
LAB_0011c23d:
  std::
  _Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ::~_Vector_base(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const do_statement& s) {
        const auto ls = get_labels(s);
        completion c{};
        do {
            c = eval(s.s());
            if (handle_completion(c, ls)) {
                return c;
            }
        } while (to_boolean(get_value(eval(s.cond()))));
        assert(!c);
        return c;//completion{c.result};
    }